

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O0

void __thiscall tf::TFProfManager::TFProfManager(TFProfManager *this)

{
  allocator<char> local_31;
  string local_30;
  TFProfManager *local_10;
  TFProfManager *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"TF_ENABLE_PROFILER",&local_31);
  get_env(&this->_fpath,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::mutex::mutex(&this->_mutex);
  std::
  vector<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
  ::vector(&this->_observers);
  return;
}

Assistant:

inline TFProfManager::TFProfManager() :
  _fpath {get_env(TF_ENABLE_PROFILER)} {

}